

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

MockSpec<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
* __thiscall
testing::internal::
FunctionMocker<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
::With(FunctionMocker<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
       *this,Matcher<fmt::BasicStringRef<char>_> *m1,
      Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&> *m2)

{
  linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_> *ptr;
  linked_ptr<const_testing::MatcherInterface<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
  *ptr_00;
  _Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
  local_48;
  
  std::
  _Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
  ::_Tuple_impl(&local_48,m1,m2);
  ptr = &local_48.super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>.
         _M_head_impl.super_MatcherBase<fmt::BasicStringRef<char>_>.impl_;
  linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_>::operator=
            ((linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_> *)
             ((long)&(this->
                     super_FunctionMockerBase<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
                     ).current_spec_.matchers_.
                     super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
                     .super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>.
                     _M_head_impl.super_MatcherBase<fmt::BasicStringRef<char>_> + 8),ptr);
  ptr_00 = &local_48.
            super__Tuple_impl<1UL,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
            .
            super__Head_base<1UL,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>,_false>
            ._M_head_impl.
            super_MatcherBase<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>
            .impl_;
  linked_ptr<const_testing::MatcherInterface<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
  ::operator=((linked_ptr<const_testing::MatcherInterface<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
               *)((long)&(this->
                         super_FunctionMockerBase<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
                         ).current_spec_.matchers_.
                         super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
                         .
                         super__Tuple_impl<1UL,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
                         .
                         super__Head_base<1UL,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>,_false>
                         ._M_head_impl + 8),ptr_00);
  local_48.super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl.
  super_MatcherBase<fmt::BasicStringRef<char>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0028e950;
  linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_>::~linked_ptr(ptr);
  local_48.
  super__Tuple_impl<1UL,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
  .
  super__Head_base<1UL,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>,_false>
  ._M_head_impl.
  super_MatcherBase<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00291818;
  linked_ptr<const_testing::MatcherInterface<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
  ::~linked_ptr(ptr_00);
  return &(this->
          super_FunctionMockerBase<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
          ).current_spec_;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1, const Matcher<A2>& m2) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1, m2));
    return this->current_spec();
  }